

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveJSON.h
# Opt level: O2

void __thiscall
chrono::ChArchiveOutJSON::ChArchiveOutJSON(ChArchiveOutJSON *this,ChStreamOutAsciiFile *mostream)

{
  uint in_EAX;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  ChArchiveOut::ChArchiveOut(&this->super_ChArchiveOut);
  (this->super_ChArchiveOut).super_ChArchive._vptr_ChArchive =
       (_func_int **)&PTR__ChArchiveOutJSON_00161340;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(&this->nitems);
  std::stack<bool,std::deque<bool,std::allocator<bool>>>::
  stack<std::deque<bool,std::allocator<bool>>,void>(&this->is_array);
  this->ostream = mostream;
  chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(mostream + 0x2d0),"{ ");
  *(undefined4 *)&(this->super_ChArchiveOut).field_0x104 = 1;
  uStack_28 = (ulong)(uint)uStack_28;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>
            (&(this->nitems).c,(int *)((long)&uStack_28 + 4));
  uStack_28._0_4_ = (uint)(uint3)uStack_28;
  std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
            (&(this->is_array).c,(bool *)((long)&uStack_28 + 3));
  return;
}

Assistant:

ChArchiveOutJSON( ChStreamOutAsciiFile& mostream) {
          ostream = &mostream;
          
          (*ostream) << "{ ";
          ++tablevel;

          tablevel = 1;
          nitems.push(0);
          is_array.push(false);
      }